

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::DuplicateOrdinalDetector::check
          (DuplicateOrdinalDetector *this,Reader ordinal)

{
  ErrorReporter *pEVar1;
  uint64_t uVar2;
  Reader *this_00;
  char (*in_R8) [46];
  String local_98;
  ArrayPtr<const_char> local_80 [2];
  uint64_t local_60;
  String local_58;
  ArrayPtr<const_char> local_40;
  Reader *local_30;
  Reader *last;
  Reader *_last894;
  DuplicateOrdinalDetector *local_10;
  DuplicateOrdinalDetector *this_local;
  
  local_10 = this;
  uVar2 = LocatedInteger::Reader::getValue(&ordinal);
  if (uVar2 < this->expectedOrdinal) {
    pEVar1 = this->errorReporter;
    kj::StringPtr::StringPtr((StringPtr *)&_last894,"Duplicate ordinal number.");
    ErrorReporter::addErrorOn<capnp::compiler::LocatedInteger::Reader&>
              (pEVar1,&ordinal,(StringPtr)__last894);
    this_00 = kj::_::readMaybe<capnp::compiler::LocatedInteger::Reader>(&this->lastOrdinalLocation);
    if (this_00 != (Reader *)0x0) {
      pEVar1 = this->errorReporter;
      local_30 = this_00;
      last = this_00;
      local_60 = LocatedInteger::Reader::getValue(this_00);
      kj::str<char_const(&)[10],unsigned_long,char_const(&)[23]>
                (&local_58,(kj *)"Ordinal @",(char (*) [10])&local_60,
                 (unsigned_long *)" originally used here.",(char (*) [23])in_R8);
      kj::StringPtr::StringPtr((StringPtr *)&local_40,&local_58);
      ErrorReporter::addErrorOn<capnp::compiler::LocatedInteger::Reader&>
                (pEVar1,this_00,(StringPtr)local_40);
      kj::String::~String(&local_58);
      kj::Maybe<capnp::compiler::LocatedInteger::Reader>::operator=(&this->lastOrdinalLocation);
    }
  }
  else {
    uVar2 = LocatedInteger::Reader::getValue(&ordinal);
    if (this->expectedOrdinal < uVar2) {
      pEVar1 = this->errorReporter;
      kj::str<char_const(&)[18],unsigned_int&,char_const(&)[46]>
                (&local_98,(kj *)"Skipped ordinal @",(char (*) [18])&this->expectedOrdinal,
                 (uint *)".  Ordinals must be sequential with no holes.",in_R8);
      kj::StringPtr::StringPtr((StringPtr *)local_80,&local_98);
      ErrorReporter::addErrorOn<capnp::compiler::LocatedInteger::Reader&>
                (pEVar1,&ordinal,(StringPtr)local_80[0]);
      kj::String::~String(&local_98);
      uVar2 = LocatedInteger::Reader::getValue(&ordinal);
      this->expectedOrdinal = (int)uVar2 + 1;
    }
    else {
      this->expectedOrdinal = this->expectedOrdinal + 1;
      kj::Maybe<capnp::compiler::LocatedInteger::Reader>::operator=
                (&this->lastOrdinalLocation,&ordinal);
    }
  }
  return;
}

Assistant:

void check(LocatedInteger::Reader ordinal) {
    if (ordinal.getValue() < expectedOrdinal) {
      errorReporter.addErrorOn(ordinal, "Duplicate ordinal number.");
      KJ_IF_SOME(last, lastOrdinalLocation) {
        errorReporter.addErrorOn(
            last, kj::str("Ordinal @", last.getValue(), " originally used here."));
        // Don't report original again.
        lastOrdinalLocation = kj::none;
      }
    } else if (ordinal.getValue() > expectedOrdinal) {
      errorReporter.addErrorOn(ordinal,
          kj::str("Skipped ordinal @", expectedOrdinal, ".  Ordinals must be sequential with no "
                  "holes."));
      expectedOrdinal = ordinal.getValue() + 1;
    } else {
      ++expectedOrdinal;
      lastOrdinalLocation = ordinal;
    }
  }